

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall
CS248::Camera::configure(Camera *this,CameraInfo *info,size_t screenW,size_t screenH)

{
  double in_RCX;
  double in_RDX;
  long in_RSI;
  double *in_RDI;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double ar1;
  undefined4 uVar6;
  
  in_RDI[0x19] = in_RDX;
  in_RDI[0x1a] = in_RCX;
  in_RDI[3] = (double)*(float *)(in_RSI + 0x98);
  in_RDI[4] = (double)*(float *)(in_RSI + 0x9c);
  *in_RDI = (double)*(float *)(in_RSI + 0x90);
  in_RDI[1] = (double)*(float *)(in_RSI + 0x94);
  dVar1 = radians<double>(*in_RDI);
  dVar2 = tan(dVar1 * 0.5);
  dVar1 = radians<double>(in_RDI[1]);
  dVar1 = tan(dVar1 * 0.5);
  dVar2 = dVar2 / dVar1;
  auVar3._8_4_ = (int)((ulong)in_RDX >> 0x20);
  auVar3._0_8_ = in_RDX;
  auVar3._12_4_ = 0x45300000;
  uVar6 = (undefined4)((ulong)in_RCX >> 0x20);
  auVar5._8_4_ = uVar6;
  auVar5._0_8_ = in_RCX;
  auVar5._12_4_ = 0x45300000;
  in_RDI[2] = ((auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(in_RDX,0)) - 4503599627370496.0)) /
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(in_RCX,0)) - 4503599627370496.0));
  if (in_RDI[2] <= dVar2) {
    if (in_RDI[2] <= dVar2 && dVar2 != in_RDI[2]) {
      dVar1 = radians<double>(*in_RDI);
      dVar1 = tan(dVar1 / 2.0);
      dVar1 = atan(dVar1 / in_RDI[2]);
      dVar1 = degrees<double>(dVar1);
      in_RDI[1] = dVar1 * 2.0;
    }
  }
  else {
    dVar1 = radians<double>(in_RDI[1]);
    dVar1 = tan(dVar1 / 2.0);
    dVar1 = atan(dVar1 * in_RDI[2]);
    dVar1 = degrees<double>(dVar1);
    *in_RDI = dVar1 * 2.0;
  }
  auVar4._8_4_ = uVar6;
  auVar4._0_8_ = in_RCX;
  auVar4._12_4_ = 0x45300000;
  dVar1 = radians<double>(in_RDI[1]);
  dVar1 = tan(dVar1 / 2.0);
  in_RDI[0x1b] = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(in_RCX,0)) - 4503599627370496.0)) /
                 (dVar1 * 2.0);
  return;
}

Assistant:

void Camera::configure(const CameraInfo& info, size_t screenW, size_t screenH) {
    this->screenW = screenW;
    this->screenH = screenH;
    nClip = info.nClip;
    fClip = info.fClip;
    hFov = info.hFov;
    vFov = info.vFov;
  //  targetPos = info.view_dir;
  //  acos(c_dir.y), atan2(c_dir.x, c_dir.z)

    double ar1 = tan(radians(hFov) / 2) / tan(radians(vFov) / 2);
    ar = static_cast<double>(screenW) / screenH;
    if (ar1 < ar) {
        // hFov is too small
        hFov = 2 * degrees(atan(tan(radians(vFov) / 2) * ar));
    } else if (ar1 > ar) {
        // vFov is too small
        vFov = 2 * degrees(atan(tan(radians(hFov) / 2) / ar));
    }
    screenDist = ((double)screenH) / (2.0 * tan(radians(vFov) / 2));
}